

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O2

int * Gia_SortGetTest(int nSize)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  srand(0);
  piVar2 = (int *)malloc((long)nSize * 4);
  uVar4 = (ulong)(uint)nSize;
  if (nSize < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = rand();
    piVar2[uVar3] = iVar1;
  }
  return piVar2;
}

Assistant:

int * Gia_SortGetTest( int nSize )
{
    int i, * pArray;
    srand( 0 );
    pArray = ABC_ALLOC( int, nSize );
    for ( i = 0; i < nSize; i++ )
        pArray[i] = rand();
    return pArray;
}